

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_color.h
# Opt level: O0

void * __thiscall
crnlib::pixel_packer::pack<crnlib::color_quad<unsigned_char,int>>
          (pixel_packer *this,color_quad<unsigned_char,_int> *color,void *p,bool rescale)

{
  uint uVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  int iVar4;
  sbyte sVar5;
  uint bit_mask;
  uint byte_val;
  uint cur_byte_bits;
  uint cur_byte_bit_ofs;
  uint dst_bit_ofs;
  uint src_bit_ofs;
  uint32 h;
  uint32 n;
  uint32 mx;
  uint comp_size;
  uint i;
  uint8 *pDst;
  bool rescale_local;
  void *p_local;
  color_quad<unsigned_char,_int> *color_local;
  pixel_packer *this_local;
  
  for (mx = 0; mx < 4; mx = mx + 1) {
    uVar1 = this->m_comp_size[mx];
    if (uVar1 != 0) {
      h = this->m_comp_max[mx];
      if (rescale) {
        bVar3 = color_quad<unsigned_char,_int>::operator[](color,mx);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (ulong)bVar3 * (ulong)h + 0x7f;
        src_bit_ofs = SUB164(auVar2 / ZEXT816(0xff),0);
      }
      else {
        bVar3 = color_quad<unsigned_char,_int>::operator[](color,mx);
        src_bit_ofs = math::minimum<unsigned_int>((uint)bVar3,h);
      }
      cur_byte_bit_ofs = 0;
      cur_byte_bits = this->m_comp_ofs[mx];
      for (; cur_byte_bit_ofs < uVar1; cur_byte_bit_ofs = iVar4 + cur_byte_bit_ofs) {
        iVar4 = 8 - (cur_byte_bits & 7);
        sVar5 = (sbyte)(cur_byte_bits & 7);
        *(byte *)((long)p + (ulong)(cur_byte_bits >> 3)) =
             (byte)(src_bit_ofs << sVar5) |
             ((byte)(h << sVar5) ^ 0xff) & *(byte *)((long)p + (ulong)(cur_byte_bits >> 3));
        h = h >> ((byte)iVar4 & 0x1f);
        src_bit_ofs = src_bit_ofs >> ((byte)iVar4 & 0x1f);
        cur_byte_bits = iVar4 + cur_byte_bits;
      }
    }
  }
  return (void *)((long)p + (ulong)this->m_pixel_stride);
}

Assistant:

void* pack(const color_quad_type& color, void* p, bool rescale = true) const
        {
            uint8* pDst = static_cast<uint8*>(p);

            for (uint i = 0; i < 4; i++)
            {
                const uint comp_size = m_comp_size[i];
                if (!comp_size)
                {
                    continue;
                }

                uint32 mx = m_comp_max[i];

                uint32 n;
                if (color_quad_type::component_traits::cFloat)
                {
                    typename color_quad_type::parameter_t t = color[i];
                    if (t < 0.0f)
                    {
                        n = 0;
                    }
                    else if (t > static_cast<typename color_quad_type::parameter_t>(mx))
                    {
                        n = mx;
                    }
                    else
                    {
                        n = math::minimum<uint32>(static_cast<uint32>(floor(t + .5f)), mx);
                    }
                }
                else if (rescale)
                {
                    if (color_quad_type::component_traits::cSigned)
                    {
                        n = math::maximum<int>(static_cast<int>(color[i]), 0);
                    }
                    else
                    {
                        n = static_cast<uint32>(color[i]);
                    }
                    const uint32 h = static_cast<uint32>(color_quad_type::component_traits::cMax);
                    n = static_cast<uint32>((static_cast<uint64>(n) * mx + (h >> 1)) / h);
                }
                else
                {
                    if (color_quad_type::component_traits::cSigned)
                    {
                        n = math::minimum<uint32>(static_cast<uint32>(math::maximum<int>(static_cast<int>(color[i]), 0)), mx);
                    }
                    else
                    {
                        n = math::minimum<uint32>(static_cast<uint32>(color[i]), mx);
                    }
                }

                uint src_bit_ofs = 0;
                uint dst_bit_ofs = m_comp_ofs[i];
                while (src_bit_ofs < comp_size)
                {
                    const uint cur_byte_bit_ofs = (dst_bit_ofs & 7);
                    const uint cur_byte_bits = 8 - cur_byte_bit_ofs;

                    uint byte_val = pDst[dst_bit_ofs >> 3];
                    uint bit_mask = (mx << cur_byte_bit_ofs) & 0xFF;
                    byte_val &= ~bit_mask;
                    byte_val |= (n << cur_byte_bit_ofs);
                    pDst[dst_bit_ofs >> 3] = static_cast<uint8>(byte_val);

                    mx >>= cur_byte_bits;
                    n >>= cur_byte_bits;

                    dst_bit_ofs += cur_byte_bits;
                    src_bit_ofs += cur_byte_bits;
                }
            }

            return pDst + m_pixel_stride;
        }